

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

SUNErrCode SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)

{
  void *__ptr;
  
  if (NLS != (SUNNonlinearSolver)0x0) {
    if (NLS->content != (void *)0x0) {
      if (*(long *)((long)NLS->content + 0x20) != 0) {
        N_VDestroy();
      }
      __ptr = NLS->content;
      *(undefined8 *)((long)__ptr + 0x20) = 0;
      free(__ptr);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (SUNNonlinearSolver_Ops)0x0) {
      free(NLS->ops);
      NLS->ops = (SUNNonlinearSolver_Ops)0x0;
    }
    free(NLS);
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL) { return SUN_SUCCESS; }

  SUNFunctionBegin(NLS->sunctx);
  /* free items from contents, then the generic structure */
  if (NLS->content)
  {
    if (NEWTON_CONTENT(NLS)->delta)
    {
      N_VDestroy(NEWTON_CONTENT(NLS)->delta);
      SUNCheckLastErr();
    }
    NEWTON_CONTENT(NLS)->delta = NULL;

    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops)
  {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the nonlinear solver */
  free(NLS);

  return SUN_SUCCESS;
}